

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<duckdb_libpgquery::GroupingSetKind>
          (InternalException *this,string *msg,GroupingSetKind params)

{
  string local_30;
  
  Exception::ConstructMessage<duckdb_libpgquery::GroupingSetKind>(&local_30,msg,params);
  InternalException(this,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}